

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_rc_update_framerate(AV1_COMP *cpi,int width,int height)

{
  int iVar1;
  int iVar2;
  AV1_COMP *cpi_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double d;
  int64_t vbr_max_bits;
  int64_t vbr_min_bits;
  int MBs;
  RATE_CONTROL *rc;
  AV1EncoderConfig *oxcf;
  int local_5c;
  int in_stack_ffffffffffffffa8;
  int local_44;
  long local_40;
  
  iVar1 = av1_get_MBs(in_ESI,in_EDX);
  d = round((double)*(long *)(in_RDI + 0x423a8) / *(double *)(in_RDI + 0x608b0));
  iVar2 = saturate_cast_double_to_int(d);
  *(int *)(in_RDI + 0x607f4) = iVar2;
  local_40 = ((long)*(int *)(in_RDI + 0x607f4) * (long)*(int *)(in_RDI + 0x423e4)) / 100;
  if (0x7ffffffe < local_40) {
    local_40 = 0x7fffffff;
  }
  local_44 = (int)local_40;
  if (local_44 < 0xc9) {
    local_44 = 200;
  }
  *(int *)(in_RDI + 0x607f8) = local_44;
  cpi_00 = (AV1_COMP *)(((long)*(int *)(in_RDI + 0x607f4) * (long)*(int *)(in_RDI + 0x423e8)) / 100)
  ;
  if (0x7ffffffe < (long)cpi_00) {
    cpi_00 = (AV1_COMP *)0x7fffffff;
  }
  if (iVar1 * 0xfa < 0x1ee629) {
    iVar2 = 0x1ee628;
  }
  else {
    iVar2 = iVar1 * 0xfa;
  }
  local_5c = (int)cpi_00;
  if (local_5c < iVar2) {
    if (iVar1 * 0xfa < 0x1ee629) {
      local_5c = 0x1ee628;
      in_stack_ffffffffffffffa8 = local_5c;
    }
    else {
      local_5c = iVar1 * 0xfa;
      in_stack_ffffffffffffffa8 = local_5c;
    }
  }
  *(int *)(in_RDI + 0x607fc) = local_5c;
  set_gf_interval_range(cpi_00,(RATE_CONTROL *)CONCAT44(iVar2,in_stack_ffffffffffffffa8));
  return;
}

Assistant:

void av1_rc_update_framerate(AV1_COMP *cpi, int width, int height) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  RATE_CONTROL *const rc = &cpi->rc;
  const int MBs = av1_get_MBs(width, height);

  rc->avg_frame_bandwidth = saturate_cast_double_to_int(
      round(oxcf->rc_cfg.target_bandwidth / cpi->framerate));

  int64_t vbr_min_bits =
      (int64_t)rc->avg_frame_bandwidth * oxcf->rc_cfg.vbrmin_section / 100;
  vbr_min_bits = AOMMIN(vbr_min_bits, INT_MAX);

  rc->min_frame_bandwidth = AOMMAX((int)vbr_min_bits, FRAME_OVERHEAD_BITS);

  // A maximum bitrate for a frame is defined.
  // The baseline for this aligns with HW implementations that
  // can support decode of 1080P content up to a bitrate of MAX_MB_RATE bits
  // per 16x16 MB (averaged over a frame). However this limit is extended if
  // a very high rate is given on the command line or the rate cannot
  // be achieved because of a user specified max q (e.g. when the user
  // specifies lossless encode.
  int64_t vbr_max_bits =
      (int64_t)rc->avg_frame_bandwidth * oxcf->rc_cfg.vbrmax_section / 100;
  vbr_max_bits = AOMMIN(vbr_max_bits, INT_MAX);

  rc->max_frame_bandwidth =
      AOMMAX(AOMMAX((MBs * MAX_MB_RATE), MAXRATE_1080P), (int)vbr_max_bits);

  set_gf_interval_range(cpi, rc);
}